

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

uint __thiscall
Js::AsmJsByteCodeWriter::EnterLoop(AsmJsByteCodeWriter *this,ByteCodeLabel loopEntrance)

{
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  undefined1 local_24 [6];
  OpCodeAsmJs loopBodyOpcode;
  uint local_18;
  ByteCodeLabel local_14;
  uint loopId;
  ByteCodeLabel loopEntrance_local;
  AsmJsByteCodeWriter *this_local;
  
  local_14 = loopEntrance;
  _loopId = this;
  local_18 = FunctionBody::IncrLoopCount((this->super_ByteCodeWriter).m_functionWrite);
  uVar3 = JsUtil::
          ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
          ::Count(&((this->super_ByteCodeWriter).m_loopHeaders)->
                   super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
                 );
  if (uVar3 != local_18) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                ,0x27a,"((uint)m_loopHeaders->Count() == loopId)",
                                "(uint)m_loopHeaders->Count() == loopId");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = (this->super_ByteCodeWriter).m_loopHeaders;
  uVar3 = ByteCodeWriter::Data::GetCurrentOffset(&(this->super_ByteCodeWriter).m_byteCodeData);
  ByteCodeWriter::LoopHeaderData::LoopHeaderData
            ((LoopHeaderData *)local_24,uVar3,0,0 < (this->super_ByteCodeWriter).m_loopNest,false);
  JsUtil::
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(this_00,(LoopHeaderData *)local_24);
  (this->super_ByteCodeWriter).m_loopNest = (this->super_ByteCodeWriter).m_loopNest + 1;
  MarkAsmJsLabel(this,local_14);
  AsmJsUnsigned1(this,AsmJsLoopBodyStart,local_18);
  return local_18;
}

Assistant:

uint AsmJsByteCodeWriter::EnterLoop(Js::ByteCodeLabel loopEntrance)
    {
        uint loopId = m_functionWrite->IncrLoopCount();
        Assert((uint)m_loopHeaders->Count() == loopId);

        m_loopHeaders->Add(LoopHeaderData(m_byteCodeData.GetCurrentOffset(), 0, m_loopNest > 0, false));
        m_loopNest++;
        Js::OpCodeAsmJs loopBodyOpcode = Js::OpCodeAsmJs::AsmJsLoopBodyStart;
        this->MarkAsmJsLabel(loopEntrance);
        this->AsmJsUnsigned1(loopBodyOpcode, loopId);

        return loopId;
    }